

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_slice.c
# Opt level: O2

MPP_RET process_slice(H264_SLICE_t *currSlice)

{
  bitread_ctx_t *pbVar1;
  RecoveryPoint *pRVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  H264NalRefIdcType HVar7;
  RK_U32 RVar8;
  RK_U32 RVar9;
  H264dVideoCtx_t *p_Vid;
  h264_dec_ctx_t *phVar10;
  h264_pps_t *phVar11;
  h264_sps_t *phVar12;
  RK_S64 RVar13;
  h264_drpm_t *phVar14;
  MPP_RET MVar15;
  uint uVar16;
  h264_subsps_t *phVar17;
  h264d_video_ctx_t *phVar18;
  h264_drpm_t *phVar19;
  h264_drpm_t **pphVar20;
  RK_S32 *pRVar21;
  h264_drpm_t *phVar22;
  uint uVar23;
  char *pcVar24;
  H264_PPS_t *pHVar25;
  ulong uVar26;
  int iVar27;
  RK_U32 *pRVar28;
  undefined8 uVar29;
  uint uVar30;
  uint uVar31;
  h264_subsps_t *phVar32;
  RK_S32 RVar33;
  h264d_cur_ctx_t *phVar34;
  long lVar35;
  BitReadCtx_t *bitctx;
  ulong uVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  RK_U32 _out;
  H264_PPS_t *local_50;
  h264_subsps_t *local_48;
  RK_S32 local_3c;
  h264_drpm_t **local_38;
  
  phVar34 = currSlice->p_Cur;
  phVar18 = currSlice->p_Vid;
  pbVar1 = &phVar34->bitctx;
  currSlice->p_Dpb_layer[0] = phVar18->p_Dpb_layer[0];
  currSlice->p_Dpb_layer[1] = phVar18->p_Dpb_layer[1];
  MVar15 = mpp_read_ue(pbVar1,&_out);
  (phVar34->bitctx).ret = MVar15;
  if (MVar15 != MPP_OK) {
    return MVar15;
  }
  currSlice->start_mb_nr = _out;
  MVar15 = mpp_read_ue(pbVar1,&_out);
  (phVar34->bitctx).ret = MVar15;
  if (MVar15 != MPP_OK) {
    return MVar15;
  }
  uVar23 = _out % 5;
  currSlice->slice_type = uVar23;
  phVar18->slice_type = uVar23;
  if (uVar23 - 3 < 2) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_ERR_UNKNOW;
    }
    _mpp_log_l(4,"h264d_slice","sp or si slice not support\n",(char *)0x0);
    return MPP_ERR_UNKNOW;
  }
  MVar15 = mpp_read_ue(pbVar1,&_out);
  (phVar34->bitctx).ret = MVar15;
  if (MVar15 != MPP_OK) {
    return MVar15;
  }
  currSlice->pic_parameter_set_id = _out;
  p_Vid = currSlice->p_Vid;
  uVar23 = (uint)((currSlice->p_Cur->nalu).nalu_type == H264_NALU_TYPE_IDR);
  currSlice->idr_flag = uVar23;
  HVar7 = (currSlice->p_Cur->nalu).nal_reference_idc;
  currSlice->nal_reference_idc = HVar7;
  phVar10 = p_Vid->p_Dec;
  (phVar10->errctx).used_ref_flag = (uint)(HVar7 != H264_NALU_PRIORITY_DISPOSABLE);
  if (currSlice->slice_type == 2) {
    (phVar10->errctx).dpb_err_flag = 0;
  }
  if ((currSlice->svc_extension_flag == 0) || ((currSlice->mvcExt).iPrefixNALU != 0)) {
    uVar23 = (currSlice->mvcExt).view_id;
    pRVar28 = (RK_U32 *)(ulong)uVar23;
    currSlice->view_id = uVar23;
    RVar8 = (currSlice->mvcExt).inter_view_flag;
    currSlice->anchor_pic_flag = (currSlice->mvcExt).anchor_pic_flag;
    currSlice->inter_view_flag = RVar8;
  }
  else if (currSlice->svc_extension_flag == -1) {
    if ((currSlice->mvcExt).valid == 0) {
      uVar31 = 0;
    }
    else {
      uVar31 = *p_Vid->active_subsps->view_id;
    }
    pRVar28 = (RK_U32 *)(ulong)uVar31;
    currSlice->view_id = uVar31;
    currSlice->inter_view_flag = 1;
    currSlice->anchor_pic_flag = uVar23;
  }
  else {
    pRVar28 = (RK_U32 *)(ulong)(uint)currSlice->view_id;
  }
  currSlice->layer_id = (int)pRVar28;
  if (-1 < (int)pRVar28) {
    currSlice->p_Dpb = p_Vid->p_Dpb_layer[(long)pRVar28];
  }
  if (((_out < 0x100) && (phVar11 = p_Vid->ppsSet[_out], phVar11 != (h264_pps_t *)0x0)) &&
     (phVar11->Valid != 0)) {
    if ((currSlice->mvcExt).valid == 0) {
      p_Vid->active_mvc_sps_flag = 0;
      uVar26 = (ulong)phVar11->seq_parameter_set_id;
LAB_001884e8:
      phVar32 = (h264_subsps_t *)p_Vid->spsSet[uVar26];
      if ((h264_subsps_t *)p_Vid->spsSet[uVar26] != (h264_subsps_t *)0x0) {
LAB_001884f5:
        uVar23 = (uint)uVar26;
        if ((phVar32->sps).Valid != 0) {
          phVar17 = (H264_subSPS_t *)0x0;
          goto LAB_00188501;
        }
      }
      MVar15 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) != 0) {
        pcVar24 = "value error(%d).\n";
        uVar29 = 0x188;
        goto LAB_0018846f;
      }
      goto LAB_00188476;
    }
    uVar23 = phVar11->seq_parameter_set_id;
    uVar26 = (ulong)uVar23;
    phVar17 = p_Vid->subspsSet[uVar26];
    if (((phVar17 == (h264_subsps_t *)0x0) || (phVar17->Valid == 0)) ||
       (phVar17->num_views_minus1 < 1)) {
LAB_00188438:
      p_Vid->active_mvc_sps_flag = 0;
      goto LAB_001884e8;
    }
    RVar8 = (currSlice->mvcExt).view_id;
    pRVar28 = (RK_U32 *)phVar17->view_id;
    if (RVar8 == *pRVar28) goto LAB_00188438;
    phVar32 = phVar17;
    if (RVar8 != pRVar28[1]) {
      if (p_Vid->active_mvc_sps_flag != 0) goto LAB_00188501;
      goto LAB_001884f5;
    }
    p_Vid->active_mvc_sps_flag = 1;
LAB_00188501:
    uVar31 = (phVar32->sps).seq_parameter_set_id;
    uVar3 = (phVar32->sps).bit_depth_luma_minus8;
    uVar4 = (phVar32->sps).bit_depth_chroma_minus8;
    uVar5 = (phVar32->sps).log2_max_frame_num_minus4;
    uVar6 = (phVar32->sps).pic_order_cnt_type;
    auVar38._0_4_ = -(uint)(2 < (int)uVar3);
    auVar38._4_4_ = -(uint)(2 < (int)uVar4);
    auVar38._8_4_ = -(uint)(0xc < (int)uVar5);
    auVar38._12_4_ = -(uint)(2 < (int)uVar6);
    iVar27 = movmskps((int)pRVar28,auVar38);
    if (((iVar27 == 0) && ((phVar32->sps).chroma_format_idc < 3)) &&
       (((phVar32->sps).log2_max_pic_order_cnt_lsb_minus4 < 0xd &&
        (((((phVar32->sps).num_ref_frames_in_pic_order_cnt_cycle < 0x100 &&
           ((phVar32->sps).max_num_ref_frames < 0x11)) &&
          ((phVar32->sps).separate_colour_plane_flag != 1)) &&
         (((phVar32->sps).qpprime_y_zero_transform_bypass_flag != 1 && (uVar31 < 0x20)))))))) {
      if (phVar10->hw_info == (MppDecHwCap *)0x0) {
        uVar30 = 0x77;
      }
      else {
        uVar16 = (uint)*(undefined8 *)&phVar10->hw_info->field_0x4;
        if ((uVar16 >> 0xd & 1) == 0) {
          uVar30 = 0xff;
          if ((uVar16 >> 0xc & 1) == 0) {
            uVar30 = 0x77;
          }
        }
        else {
          uVar30 = (uVar16 >> 0x15 & 7) * 0x1ff;
        }
      }
      uVar16 = (phVar32->sps).pic_width_in_mbs_minus1;
      if ((int)uVar16 < 3) {
        if (((byte)h264d_debug & 1) != 0) {
          uVar30 = uVar16 * 0x10 + 0x10;
          pcVar24 = "sps %d too small width %d\n";
LAB_001886bc:
          _mpp_log_l(4,"h264d_slice",pcVar24,(char *)0x0,(ulong)uVar31,(ulong)uVar30);
        }
        goto LAB_001886c3;
      }
      if (uVar30 < uVar16) {
        if (((byte)h264d_debug & 1) != 0) {
          uVar31 = uVar16 * 0x10 + 0x10;
          uVar30 = uVar30 << 4;
          pcVar24 = "width %d is larger than soc max support %d\n";
          goto LAB_001886bc;
        }
        goto LAB_001886c3;
      }
      if (phVar17 != (H264_subSPS_t *)0x0) {
        bVar37 = phVar17->num_views_minus1 != 1;
        if (0 < *phVar17->num_anchor_refs_l0) {
          bVar37 = **phVar17->anchor_ref_l0 != *phVar17->view_id || phVar17->num_views_minus1 != 1;
        }
        if (0 < *phVar17->num_anchor_refs_l1) {
          bVar37 = (bool)(bVar37 | **phVar17->anchor_ref_l1 != phVar17->view_id[1]);
        }
        if (0 < *phVar17->num_non_anchor_refs_l0) {
          bVar37 = (bool)(bVar37 | **phVar17->non_anchor_ref_l0 != *phVar17->view_id);
        }
        if (0 < *phVar17->num_non_anchor_refs_l1) {
          bVar37 = (bool)(bVar37 | **phVar17->non_anchor_ref_l1 != phVar17->view_id[1]);
        }
        if (bVar37) {
          if (((byte)h264d_debug & 1) != 0) {
            pcVar24 = "subsps has error, sps_id=%d";
            goto LAB_001885f5;
          }
          goto LAB_001886c3;
        }
      }
      uVar30 = phVar11->pic_parameter_set_id;
      if (((phVar11->redundant_pic_cnt_present_flag == 1) || (0x1f < uVar23)) ||
         ((((0xff < uVar30 ||
            (((0 < phVar11->num_slice_groups_minus1 ||
              (0x1f < phVar11->num_ref_idx_l0_default_active_minus1)) ||
             (0x1f < phVar11->num_ref_idx_l1_default_active_minus1)))) ||
           (((0x19 < phVar11->pic_init_qp_minus26 ||
             (phVar11->pic_init_qp_minus26 < uVar3 * -6 + -0x1a)) ||
            (phVar11->pic_init_qs_minus26 - 0x1aU < 0xffffffcc)))) ||
          (phVar11->chroma_qp_index_offset - 0xdU < 0xffffffe7)))) {
        if (((byte)h264d_debug & 1) != 0) {
          pcVar24 = "pps has error, sps_id=%d, pps_id";
          goto LAB_001886bc;
        }
        goto LAB_001886c3;
      }
      local_50 = phVar11;
      local_48 = phVar32;
      MVar15 = activate_sps(p_Vid,&phVar32->sps,phVar17);
      if (MVar15 < MPP_OK) {
        if (((byte)h264d_debug & 4) != 0) {
          pcVar24 = "Function error(%d).\n";
          uVar29 = 0x18b;
          goto LAB_0018846f;
        }
      }
      else {
        MVar15 = activate_pps(p_Vid,local_50);
        if (MPP_NOK < MVar15) {
          RVar8 = (local_48->sps).seq_parameter_set_id;
          RVar9 = local_50->pic_parameter_set_id;
          if ((p_Vid->last_sps_id != RVar8) || (p_Vid->last_pps_id != RVar9)) {
            p_Vid->last_sps_id = RVar8;
            p_Vid->last_pps_id = RVar9;
            p_Vid->spspps_update = 1;
          }
          if (p_Vid->p_Dec->mvc_valid != '\0') {
            phVar17 = p_Vid->subspsSet[local_50->seq_parameter_set_id];
            if ((phVar17 == (h264_subsps_t *)0x0) || (phVar17->Valid == 0)) {
              phVar17 = (h264_subsps_t *)0x0;
            }
            p_Vid->active_subsps = phVar17;
          }
          phVar12 = p_Vid->active_sps;
          currSlice->active_sps = phVar12;
          currSlice->active_pps = p_Vid->active_pps;
          p_Vid->type = currSlice->slice_type;
          MVar15 = mpp_read_bits(pbVar1,phVar12->log2_max_frame_num_minus4 + 4,(RK_S32 *)&_out);
          (phVar34->bitctx).ret = MVar15;
          if (MVar15 != MPP_OK) {
            return MVar15;
          }
          pRVar2 = &phVar18->recovery;
          currSlice->frame_num = _out;
          if (pRVar2->valid_flag != 0) {
            if ((phVar18->recovery).first_frm_valid == 0) {
              (phVar18->recovery).first_frm_id = _out;
              (phVar18->recovery).first_frm_valid = 1;
              (phVar18->recovery).recovery_pic_id = (phVar18->recovery).recovery_frame_cnt + _out;
              if ((h264d_debug._1_1_ & 0x40) != 0) {
                _mpp_log_l(4,"h264d_slice","First recovery frame found, frame_num %d",(char *)0x0);
              }
            }
            else if ((phVar18->recovery).recovery_pic_id % phVar18->max_frame_num < (int)_out) {
              pRVar2->valid_flag = 0;
              pRVar2->recovery_frame_cnt = 0;
              pRVar2->first_frm_id = 0;
              pRVar2->first_frm_valid = 0;
              (phVar18->recovery).recovery_pic_id = 0;
            }
          }
          RVar33 = 3;
          if (currSlice->active_sps->frame_mbs_only_flag == 0) {
            MVar15 = mpp_read_bits(pbVar1,1,(RK_S32 *)&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 != MPP_OK) {
              return MVar15;
            }
            currSlice->field_pic_flag = _out;
            if (_out == 0) {
              phVar18->structure = 3;
              currSlice->bottom_field_flag = 0;
            }
            else {
              MVar15 = mpp_read_bits(pbVar1,1,(RK_S32 *)&_out);
              (phVar34->bitctx).ret = MVar15;
              if (MVar15 != MPP_OK) {
                return MVar15;
              }
              currSlice->bottom_field_flag = _out;
              RVar33 = 2 - (uint)(_out == 0);
              phVar18->structure = RVar33;
            }
          }
          else {
            phVar18->structure = 3;
            currSlice->field_pic_flag = 0;
            currSlice->bottom_field_flag = 0;
          }
          currSlice->structure = RVar33;
          if (currSlice->active_sps->mb_adaptive_frame_field_flag == 0) {
            uVar23 = 0;
          }
          else {
            uVar23 = (uint)(currSlice->field_pic_flag == 0);
          }
          currSlice->mb_aff_frame_flag = uVar23;
          if ((currSlice->idr_flag != 0) ||
             ((currSlice->svc_extension_flag == 0 && ((currSlice->mvcExt).non_idr_flag == 0)))) {
            MVar15 = mpp_read_ue(pbVar1,&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 != MPP_OK) {
              return MVar15;
            }
            currSlice->idr_pic_id = _out;
          }
          iVar27 = (phVar34->bitctx).used_bits;
          RVar13 = (phVar34->bitctx).emulation_prevention_bytes_;
          if (currSlice->active_sps->pic_order_cnt_type == 0) {
            MVar15 = mpp_read_bits(pbVar1,currSlice->active_sps->log2_max_pic_order_cnt_lsb_minus4 +
                                          4,(RK_S32 *)&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 != MPP_OK) {
              return MVar15;
            }
            currSlice->pic_order_cnt_lsb = _out;
            if ((currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1) &&
               (currSlice->field_pic_flag == 0)) {
              MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
              (phVar34->bitctx).ret = MVar15;
              if (MVar15 != MPP_OK) {
                return MVar15;
              }
              currSlice->delta_pic_order_cnt_bottom = _out;
            }
            else {
              currSlice->delta_pic_order_cnt_bottom = 0;
            }
          }
          if (currSlice->active_sps->pic_order_cnt_type == 1) {
            if (currSlice->active_sps->delta_pic_order_always_zero_flag == 0) {
              MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
              (phVar34->bitctx).ret = MVar15;
              if (MVar15 != MPP_OK) {
                return MVar15;
              }
              currSlice->delta_pic_order_cnt[0] = _out;
              if ((currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1)
                 && (currSlice->field_pic_flag == 0)) {
                MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
                (phVar34->bitctx).ret = MVar15;
                if (MVar15 != MPP_OK) {
                  return MVar15;
                }
                currSlice->delta_pic_order_cnt[1] = _out;
              }
              else {
                currSlice->delta_pic_order_cnt[1] = 0;
              }
            }
            else {
              currSlice->delta_pic_order_cnt[0] = 0;
              currSlice->delta_pic_order_cnt[1] = 0;
            }
          }
          currSlice->poc_used_bitlen =
               ((phVar34->bitctx).used_bits - iVar27) +
               ((int)RVar13 - (int)(phVar34->bitctx).emulation_prevention_bytes_) * 8;
          phVar18 = currSlice->p_Vid;
          if ((((byte)h264d_debug & 2) != 0) &&
             (phVar18->active_pps->redundant_pic_cnt_present_flag != 0)) {
            _mpp_log_l(2,"h264d_slice","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag == 0",
                       "process_slice",0x22d);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00189022;
            phVar18 = currSlice->p_Vid;
          }
          if (phVar18->active_pps->redundant_pic_cnt_present_flag != 0) {
            MVar15 = mpp_read_ue(pbVar1,&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 != MPP_OK) {
              return MVar15;
            }
            currSlice->redundant_pic_cnt = _out;
          }
          uVar23 = currSlice->slice_type;
          if (uVar23 == 1) {
            MVar15 = mpp_read_bits(pbVar1,1,(RK_S32 *)&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 != MPP_OK) {
              return MVar15;
            }
            currSlice->direct_spatial_mv_pred_flag = _out;
            uVar23 = currSlice->slice_type;
          }
          else {
            currSlice->direct_spatial_mv_pred_flag = 0;
          }
          phVar11 = currSlice->p_Vid->active_pps;
          currSlice->num_ref_idx_active[0] = phVar11->num_ref_idx_l0_default_active_minus1 + 1;
          currSlice->num_ref_idx_active[1] = phVar11->num_ref_idx_l1_default_active_minus1 + 1;
          local_50 = (H264_PPS_t *)0x21;
          if ((uVar23 < 4) && (uVar23 != 2)) {
            MVar15 = mpp_read_bits(pbVar1,1,(RK_S32 *)&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 != MPP_OK) {
              return MVar15;
            }
            currSlice->num_ref_idx_override_flag = _out;
            if (_out != 0) {
              MVar15 = mpp_read_ue(pbVar1,&_out);
              (phVar34->bitctx).ret = MVar15;
              if (MVar15 != MPP_OK) {
                return MVar15;
              }
              currSlice->num_ref_idx_active[0] = _out + 1;
              uVar23 = currSlice->slice_type;
              if (uVar23 != 1) goto LAB_00188e72;
              MVar15 = mpp_read_ue(pbVar1,&_out);
              (phVar34->bitctx).ret = MVar15;
              if (MVar15 != MPP_OK) {
                return MVar15;
              }
              currSlice->num_ref_idx_active[1] = _out + 1;
            }
            uVar23 = currSlice->slice_type;
            if (uVar23 != 1) goto LAB_00188e72;
            phVar34 = currSlice->p_Cur;
            bitctx = &phVar34->bitctx;
LAB_00189027:
            MVar15 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 == MPP_OK) {
              currSlice->ref_pic_list_reordering_flag[0] = _out;
              if (_out != 0) {
                uVar23 = currSlice->num_ref_idx_active[0] + 1;
                local_48 = (h264_subsps_t *)CONCAT44(local_48._4_4_,uVar23);
                uVar26 = 0x21;
                if (uVar23 < 0x21) {
                  uVar26 = (ulong)uVar23;
                }
                uVar36 = 0;
                do {
                  if (uVar26 == uVar36) {
                    if (((byte)h264d_debug & 4) == 0) goto LAB_00189046;
                    pcVar24 = "ref_pic_list_reordering error, i >= num_ref_idx_active[LIST_0](%d)";
                    goto LAB_001896ff;
                  }
                  MVar15 = mpp_read_ue(bitctx,&_out);
                  RVar8 = _out;
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_00189046;
                  currSlice->modification_of_pic_nums_idc[0][uVar36] = _out;
                  if (_out < 2) {
                    MVar15 = mpp_read_ue(bitctx,&_out);
                    (phVar34->bitctx).ret = MVar15;
                    if (MVar15 != MPP_OK) goto LAB_00189046;
                    pRVar21 = currSlice->abs_diff_pic_num_minus1[0];
LAB_001893d6:
                    pRVar21[uVar36] = _out;
                  }
                  else {
                    if (_out == 2) {
                      MVar15 = mpp_read_ue(bitctx,&_out);
                      (phVar34->bitctx).ret = MVar15;
                      if (MVar15 == MPP_OK) {
                        pRVar21 = currSlice->long_term_pic_idx[0];
                        goto LAB_001893d6;
                      }
                      goto LAB_00189046;
                    }
                    if ((_out & 0xfffffffe) == 4) {
                      MVar15 = mpp_read_ue(bitctx,&_out);
                      (phVar34->bitctx).ret = MVar15;
                      if (MVar15 == MPP_OK) {
                        pRVar21 = currSlice->abs_diff_view_idx_minus1[0];
                        goto LAB_001893d6;
                      }
                      goto LAB_00189046;
                    }
                  }
                  uVar36 = uVar36 + 1;
                } while (RVar8 != 3);
              }
              goto LAB_00188e9b;
            }
LAB_00189046:
            MVar15 = (phVar34->bitctx).ret;
            if (MVar15 < MPP_OK) {
              if (((byte)h264d_debug & 4) == 0) {
                return MVar15;
              }
              uVar29 = 0x249;
              goto LAB_0018849f;
            }
          }
          else {
LAB_00188e72:
            currSlice->num_ref_idx_active[1] = 0;
            phVar34 = currSlice->p_Cur;
            bitctx = &phVar34->bitctx;
            if (((int)uVar23 % 5 != 2) && ((int)uVar23 % 5 != 4)) goto LAB_00189027;
LAB_00188e9b:
            if (currSlice->slice_type % 5 == 1) {
              MVar15 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
              (phVar34->bitctx).ret = MVar15;
              if (MVar15 != MPP_OK) goto LAB_00189046;
              currSlice->ref_pic_list_reordering_flag[1] = _out;
              if (_out != 0) {
                uVar23 = currSlice->num_ref_idx_active[1] + 1;
                local_48 = (h264_subsps_t *)CONCAT44(local_48._4_4_,uVar23);
                local_50 = (H264_PPS_t *)((ulong)local_50 & 0xffffffff);
                if (uVar23 < 0x21) {
                  local_50 = (H264_PPS_t *)(ulong)uVar23;
                }
                pHVar25 = (H264_PPS_t *)0x0;
                do {
                  if (local_50 == pHVar25) {
                    if (((byte)h264d_debug & 4) != 0) {
                      pcVar24 = "ref_pic_list_reordering error, i >= num_ref_idx_active[LIST_1](%d)"
                      ;
LAB_001896ff:
                      _mpp_log_l(4,"h264d_slice",pcVar24,(char *)0x0,(ulong)local_48 & 0xffffffff);
                    }
                    goto LAB_00189046;
                  }
                  MVar15 = mpp_read_ue(bitctx,&_out);
                  RVar8 = _out;
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_00189046;
                  currSlice->modification_of_pic_nums_idc[1][(long)pHVar25] = _out;
                  if (_out < 2) {
                    MVar15 = mpp_read_ue(bitctx,&_out);
                    (phVar34->bitctx).ret = MVar15;
                    if (MVar15 != MPP_OK) goto LAB_00189046;
                    pRVar21 = currSlice->abs_diff_pic_num_minus1[1];
LAB_00188fc0:
                    pRVar21[(long)pHVar25] = _out;
                  }
                  else {
                    if (_out == 2) {
                      MVar15 = mpp_read_ue(bitctx,&_out);
                      (phVar34->bitctx).ret = MVar15;
                      if (MVar15 == MPP_OK) {
                        pRVar21 = currSlice->long_term_pic_idx[1];
                        goto LAB_00188fc0;
                      }
                      goto LAB_00189046;
                    }
                    if ((_out & 0xfffffffe) == 4) {
                      MVar15 = mpp_read_ue(bitctx,&_out);
                      (phVar34->bitctx).ret = MVar15;
                      if (MVar15 == MPP_OK) {
                        pRVar21 = currSlice->abs_diff_view_idx_minus1[1];
                        goto LAB_00188fc0;
                      }
                      goto LAB_00189046;
                    }
                  }
                  pHVar25 = (H264_PPS_t *)((long)&pHVar25->Valid + 1);
                } while (RVar8 != 3);
              }
            }
            if (((((byte)h264d_debug & 2) != 0) && (currSlice->redundant_pic_cnt != 0)) &&
               (_mpp_log_l(2,"h264d_slice","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "currSlice->redundant_pic_cnt == 0","ref_pic_list_mvc_modification",0x67)
               , (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_00189022:
              abort();
            }
          }
          phVar11 = currSlice->p_Vid->active_pps;
          if (((phVar11->weighted_pred_flag != 0) &&
              ((currSlice->slice_type == 0 || (currSlice->slice_type == 3)))) ||
             ((phVar11->weighted_bipred_idc == 1 && (currSlice->slice_type == 1)))) {
            phVar34 = currSlice->p_Cur;
            pbVar1 = &phVar34->bitctx;
            MVar15 = mpp_read_ue(pbVar1,&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 == MPP_OK) {
              if (currSlice->active_sps->chroma_format_idc != 0) {
                MVar15 = mpp_read_ue(pbVar1,&_out);
                (phVar34->bitctx).ret = MVar15;
                if (MVar15 != MPP_OK) goto LAB_001890b5;
              }
              local_50 = (H264_PPS_t *)((ulong)local_50 & 0xffffffff00000000);
              while ((int)local_50 < currSlice->num_ref_idx_active[0]) {
                MVar15 = mpp_read_bits(pbVar1,1,(RK_S32 *)&_out);
                (phVar34->bitctx).ret = MVar15;
                if (MVar15 != MPP_OK) goto LAB_001890b5;
                if (_out != 0) {
                  MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_001890b5;
                  MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_001890b5;
                }
                if (currSlice->active_sps->chroma_format_idc != 0) {
                  MVar15 = mpp_read_bits(pbVar1,1,(RK_S32 *)&_out);
                  RVar8 = _out;
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_001890b5;
                  iVar27 = 2;
                  while (bVar37 = iVar27 != 0, iVar27 = iVar27 + -1, bVar37) {
                    if (RVar8 != 0) {
                      MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
                      (phVar34->bitctx).ret = MVar15;
                      if (MVar15 != MPP_OK) goto LAB_001890b5;
                      MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
                      (phVar34->bitctx).ret = MVar15;
                      if (MVar15 != MPP_OK) goto LAB_001890b5;
                    }
                  }
                }
                local_50 = (H264_PPS_t *)CONCAT44(local_50._4_4_,(int)local_50 + 1);
              }
              if ((currSlice->slice_type == 1) &&
                 (currSlice->p_Vid->active_pps->weighted_bipred_idc == 1)) {
                local_50 = (H264_PPS_t *)((ulong)local_50 & 0xffffffff00000000);
                while ((int)local_50 < currSlice->num_ref_idx_active[1]) {
                  MVar15 = mpp_read_bits(pbVar1,1,(RK_S32 *)&_out);
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_001890b5;
                  if (_out != 0) {
                    MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
                    (phVar34->bitctx).ret = MVar15;
                    if (MVar15 != MPP_OK) goto LAB_001890b5;
                    MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
                    (phVar34->bitctx).ret = MVar15;
                    if (MVar15 != MPP_OK) goto LAB_001890b5;
                  }
                  if (currSlice->active_sps->chroma_format_idc != 0) {
                    MVar15 = mpp_read_bits(pbVar1,1,(RK_S32 *)&_out);
                    RVar8 = _out;
                    (phVar34->bitctx).ret = MVar15;
                    if (MVar15 != MPP_OK) goto LAB_001890b5;
                    iVar27 = 2;
                    while (bVar37 = iVar27 != 0, iVar27 = iVar27 + -1, bVar37) {
                      if (RVar8 != 0) {
                        MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
                        (phVar34->bitctx).ret = MVar15;
                        if (MVar15 != MPP_OK) goto LAB_001890b5;
                        MVar15 = mpp_read_se(pbVar1,(RK_S32 *)&_out);
                        (phVar34->bitctx).ret = MVar15;
                        if (MVar15 != MPP_OK) goto LAB_001890b5;
                      }
                    }
                  }
                  local_50 = (H264_PPS_t *)CONCAT44(local_50._4_4_,(int)local_50 + 1);
                }
              }
            }
            else {
LAB_001890b5:
              if (MVar15 < MPP_OK) {
                if (((byte)h264d_debug & 4) == 0) {
                  return MVar15;
                }
                uVar29 = 0x24d;
                goto LAB_0018849f;
              }
            }
          }
          currSlice->drpm_used_bitlen = 0;
          if (currSlice->nal_reference_idc == 0) goto LAB_0018965c;
          phVar34 = currSlice->p_Cur;
          phVar18 = currSlice->p_Vid;
          local_50 = (H264_PPS_t *)&phVar34->bitctx;
          local_3c = (phVar34->bitctx).used_bits;
          local_48 = (h264_subsps_t *)(phVar34->bitctx).emulation_prevention_bytes_;
          if ((currSlice->idr_flag == 0) &&
             ((currSlice->svc_extension_flag != 0 || ((currSlice->mvcExt).non_idr_flag != 0)))) {
            MVar15 = mpp_read_bits((BitReadCtx_t *)local_50,1,(RK_S32 *)&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 == MPP_OK) {
              currSlice->adaptive_ref_pic_buffering_flag = _out;
              if (_out == 0) {
switchD_00189564_caseD_0:
                currSlice->drpm_used_bitlen =
                     ((phVar34->bitctx).used_bits - local_3c) +
                     ((int)local_48 - (int)(phVar34->bitctx).emulation_prevention_bytes_) * 8;
                goto LAB_0018965c;
              }
              local_38 = &currSlice->dec_ref_pic_marking_buffer;
              for (lVar35 = 0; lVar35 != 0x23; lVar35 = lVar35 + 1) {
                phVar19 = currSlice->p_Cur->dec_ref_pic_marking_buffer[lVar35];
                if (phVar19 == (h264_drpm_t *)0x0) {
                  phVar19 = (h264_drpm_t *)mpp_osal_calloc("dec_ref_pic_marking",0x20);
                  currSlice->p_Cur->dec_ref_pic_marking_buffer[lVar35] = phVar19;
                  phVar19 = currSlice->p_Cur->dec_ref_pic_marking_buffer[lVar35];
                }
                phVar19->Next = (h264_drpm_t *)0x0;
                MVar15 = mpp_read_ue((BitReadCtx_t *)local_50,&_out);
                RVar8 = _out;
                (phVar34->bitctx).ret = MVar15;
                if (MVar15 != MPP_OK) goto LAB_0018944e;
                phVar19->memory_management_control_operation = _out;
                switch(_out) {
                case 0:
                  goto switchD_00189564_caseD_0;
                case 1:
                case 3:
                  MVar15 = mpp_read_ue((BitReadCtx_t *)local_50,&_out);
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_0018944e;
                  phVar19->difference_of_pic_nums_minus1 = _out;
                  if (RVar8 == 3) goto switchD_00189564_caseD_6;
                  if (RVar8 == 2) goto switchD_00189564_caseD_2;
                  break;
                case 2:
switchD_00189564_caseD_2:
                  MVar15 = mpp_read_ue((BitReadCtx_t *)local_50,&_out);
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_0018944e;
                  phVar19->long_term_pic_num = _out;
                  break;
                case 4:
switchD_00189564_caseD_4:
                  MVar15 = mpp_read_ue((BitReadCtx_t *)local_50,&_out);
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_0018944e;
                  phVar19->max_long_term_frame_idx_plus1 = _out;
                  break;
                case 6:
switchD_00189564_caseD_6:
                  MVar15 = mpp_read_ue((BitReadCtx_t *)local_50,&_out);
                  (phVar34->bitctx).ret = MVar15;
                  if (MVar15 != MPP_OK) goto LAB_0018944e;
                  phVar19->long_term_frame_idx = _out;
                  if (RVar8 == 4) goto switchD_00189564_caseD_4;
                }
                pphVar20 = local_38;
                phVar14 = *local_38;
                if (*local_38 != (h264_drpm_t *)0x0) {
                  do {
                    phVar22 = phVar14;
                    phVar14 = phVar22->Next;
                  } while (phVar14 != (h264_drpm_t *)0x0);
                  pphVar20 = &phVar22->Next;
                }
                *pphVar20 = phVar19;
              }
              if (((byte)h264d_debug & 1) == 0) goto LAB_0018965c;
              _mpp_log_l(4,"h264d_slice","Too many memory management control operations.",
                         (char *)0x0);
              MVar15 = (phVar34->bitctx).ret;
            }
          }
          else {
            MVar15 = mpp_read_bits((BitReadCtx_t *)local_50,1,(RK_S32 *)&_out);
            (phVar34->bitctx).ret = MVar15;
            if (MVar15 == MPP_OK) {
              currSlice->no_output_of_prior_pics_flag = _out;
              phVar18->no_output_of_prior_pics_flag = _out;
              MVar15 = mpp_read_bits((BitReadCtx_t *)local_50,1,(RK_S32 *)&_out);
              (phVar34->bitctx).ret = MVar15;
              if (MVar15 == MPP_OK) {
                currSlice->long_term_reference_flag = _out;
                goto switchD_00189564_caseD_0;
              }
            }
          }
LAB_0018944e:
          if (MPP_NOK < MVar15) {
LAB_0018965c:
            if (((byte)h264d_debug & 0x20) == 0) {
              return MPP_OK;
            }
            _mpp_log_l(4,"h264d_slice",
                       "[SLICE_HEAD] type=%d, layer_id=%d,sps_id=%d, pps_id=%d, struct=%d, frame_num=%d"
                       ,(char *)0x0,(ulong)(uint)currSlice->slice_type,
                       (ulong)(uint)currSlice->layer_id,
                       (ulong)currSlice->active_sps->seq_parameter_set_id,
                       (ulong)currSlice->active_pps->pic_parameter_set_id,
                       (ulong)(uint)currSlice->structure,(ulong)(uint)currSlice->frame_num);
            return MPP_OK;
          }
          if (((byte)h264d_debug & 4) == 0) {
            return MVar15;
          }
          uVar29 = 0x251;
          goto LAB_0018849f;
        }
        if (((byte)h264d_debug & 4) != 0) {
          pcVar24 = "Function error(%d).\n";
          uVar29 = 0x18c;
          goto LAB_0018846f;
        }
      }
    }
    else {
      if (((byte)h264d_debug & 1) != 0) {
        pcVar24 = "sps has error, sps_id=%d";
LAB_001885f5:
        _mpp_log_l(4,"h264d_slice",pcVar24,(char *)0x0);
      }
LAB_001886c3:
      MVar15 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) != 0) {
        pcVar24 = "value error(%d).\n";
        uVar29 = 0x189;
        goto LAB_0018846f;
      }
    }
  }
  else {
    MVar15 = MPP_ERR_VALUE;
    if (((byte)h264d_debug & 4) == 0) goto LAB_00188476;
    pcVar24 = "value error(%d).\n";
    uVar29 = 0x167;
LAB_0018846f:
    _mpp_log_l(4,"h264d_slice",pcVar24,(char *)0x0,uVar29);
  }
LAB_00188476:
  if (((byte)h264d_debug & 4) == 0) {
    return MVar15;
  }
  uVar29 = 0x1e7;
LAB_0018849f:
  _mpp_log_l(4,"h264d_slice","Function error(%d).\n",(char *)0x0,uVar29);
  return MVar15;
}

Assistant:

MPP_RET process_slice(H264_SLICE_t *currSlice)
{
    RK_U32 temp = 0;
    RK_U32 poc_used_bits = 0;
    RK_U32 emulation_prevention = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;
    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    RecoveryPoint *recovery = &p_Vid->recovery;

    //!< initial value
    currSlice->p_Dpb_layer[0] = p_Vid->p_Dpb_layer[0];
    currSlice->p_Dpb_layer[1] = p_Vid->p_Dpb_layer[1];

    //!< read slice head syntax
    READ_UE(p_bitctx, &currSlice->start_mb_nr); //!< first_mb_in_slice
    READ_UE(p_bitctx, &temp); //!< slice_type
    p_Vid->slice_type = currSlice->slice_type = temp % 5;
    if (p_Vid->slice_type == H264_SP_SLICE || p_Vid->slice_type == H264_SI_SLICE) {
        H264D_WARNNING("sp or si slice not support\n");
        goto __FAILED;
    }
    READ_UE(p_bitctx, &currSlice->pic_parameter_set_id);
    init_slice_parmeters(currSlice);
    FUN_CHECK(ret = set_slice_user_parmeters(currSlice));
    //!< read rest slice header syntax
    {
        READ_BITS(p_bitctx, currSlice->active_sps->log2_max_frame_num_minus4 + 4, &currSlice->frame_num);

        if (recovery->valid_flag) {
            if (!recovery->first_frm_valid) {
                recovery->first_frm_id = currSlice->frame_num;
                recovery->first_frm_valid = 1;
                recovery->recovery_pic_id = recovery->first_frm_id + recovery->recovery_frame_cnt;
                H264D_DBG(H264D_DBG_SEI, "First recovery frame found, frame_num %d", currSlice->frame_num);
            } else {
                // It may be too early to reset recovery point info when frame_num is wrapped
                if (recovery->recovery_pic_id % p_Vid->max_frame_num < currSlice->frame_num)
                    memset(&p_Vid->recovery, 0, sizeof(RecoveryPoint));
            }
        }

        if (currSlice->active_sps->frame_mbs_only_flag) { //!< user in_slice info
            p_Vid->structure = FRAME;
            currSlice->field_pic_flag = 0;
            currSlice->bottom_field_flag = 0;
        } else {
            READ_ONEBIT(p_bitctx, &currSlice->field_pic_flag);
            if (currSlice->field_pic_flag) {
                READ_ONEBIT(p_bitctx, &currSlice->bottom_field_flag);
                p_Vid->structure = currSlice->bottom_field_flag ? BOTTOM_FIELD : TOP_FIELD;
            } else {
                p_Vid->structure = FRAME;
                currSlice->bottom_field_flag = 0;
            }
        }
        currSlice->structure = p_Vid->structure;
        currSlice->mb_aff_frame_flag = currSlice->active_sps->mb_adaptive_frame_field_flag &&
                                       !currSlice->field_pic_flag;
        if (currSlice->idr_flag) {
            READ_UE(p_bitctx, &currSlice->idr_pic_id);
        } else if (currSlice->svc_extension_flag == 0 && currSlice->mvcExt.non_idr_flag == 0) {
            READ_UE(p_bitctx, &currSlice->idr_pic_id);
        }
        poc_used_bits = p_bitctx->used_bits; //!< init poc used bits
        emulation_prevention = p_bitctx->emulation_prevention_bytes_;
        if (currSlice->active_sps->pic_order_cnt_type == 0) {
            READ_BITS(p_bitctx, currSlice->active_sps->log2_max_pic_order_cnt_lsb_minus4 + 4, &currSlice->pic_order_cnt_lsb);
            if (currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1
                && !currSlice->field_pic_flag) {
                READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt_bottom);
            } else {
                currSlice->delta_pic_order_cnt_bottom = 0;
            }
        }
        if (currSlice->active_sps->pic_order_cnt_type == 1) {
            if (!currSlice->active_sps->delta_pic_order_always_zero_flag) {
                READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt[0]);

                if (currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1 && !currSlice->field_pic_flag) {
                    READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt[1]);
                } else {
                    currSlice->delta_pic_order_cnt[1] = 0;  //!< set to zero if not in stream
                }
            } else {
                currSlice->delta_pic_order_cnt[0] = 0;
                currSlice->delta_pic_order_cnt[1] = 0;
            }
        }

        // need to minus emulation prevention bytes(0x000003) we met
        emulation_prevention = p_bitctx->emulation_prevention_bytes_ - emulation_prevention;
        currSlice->poc_used_bitlen = p_bitctx->used_bits - poc_used_bits - (emulation_prevention * 8); //!< calculate poc used bit length
        //!< redundant_pic_cnt is missing here
        ASSERT(currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag == 0); // add by dw, high 4:2:2 profile not support
        if (currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag) {
            READ_UE(p_bitctx, &currSlice->redundant_pic_cnt);
        }

        if (currSlice->slice_type == H264_B_SLICE) {
            READ_ONEBIT(p_bitctx, &currSlice->direct_spatial_mv_pred_flag);
        } else {
            currSlice->direct_spatial_mv_pred_flag = 0;
        }
        currSlice->num_ref_idx_active[LIST_0] = currSlice->p_Vid->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
        currSlice->num_ref_idx_active[LIST_1] = currSlice->p_Vid->active_pps->num_ref_idx_l1_default_active_minus1 + 1;

        if (currSlice->slice_type == H264_P_SLICE
            || currSlice->slice_type == H264_SP_SLICE || currSlice->slice_type == H264_B_SLICE) {
            READ_ONEBIT(p_bitctx, &currSlice->num_ref_idx_override_flag);
            if (currSlice->num_ref_idx_override_flag) {
                READ_UE(p_bitctx, &currSlice->num_ref_idx_active[LIST_0]);
                currSlice->num_ref_idx_active[LIST_0] += 1;
                if (currSlice->slice_type == H264_B_SLICE) {
                    READ_UE(p_bitctx, &currSlice->num_ref_idx_active[LIST_1]);
                    currSlice->num_ref_idx_active[LIST_1] += 1;
                }
            }
        }
        if (currSlice->slice_type != H264_B_SLICE) {
            currSlice->num_ref_idx_active[LIST_1] = 0;
        }
        FUN_CHECK(ret = ref_pic_list_mvc_modification(currSlice));
        if ((currSlice->p_Vid->active_pps->weighted_pred_flag
             && (currSlice->slice_type == H264_P_SLICE || currSlice->slice_type == H264_SP_SLICE))
            || (currSlice->p_Vid->active_pps->weighted_bipred_idc == 1 && (currSlice->slice_type == H264_B_SLICE))) {
            FUN_CHECK(ret = pred_weight_table(currSlice));
        }
        currSlice->drpm_used_bitlen = 0;
        if (currSlice->nal_reference_idc) {
            FUN_CHECK(ret = dec_ref_pic_marking(currSlice));
        }
        H264D_DBG(H264D_DBG_PPS_SPS, "[SLICE_HEAD] type=%d, layer_id=%d,sps_id=%d, pps_id=%d, struct=%d, frame_num=%d",
                  currSlice->slice_type, currSlice->layer_id, currSlice->active_sps->seq_parameter_set_id,
                  currSlice->active_pps->pic_parameter_set_id, currSlice->structure, currSlice->frame_num);
    }

    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;
__FAILED:
    return ret;
}